

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicType.cpp
# Opt level: O2

void __thiscall
Js::DynamicObject::InitSlots
          (DynamicObject *this,DynamicObject *instance,ScriptContext *scriptContext)

{
  int iVar1;
  DynamicTypeHandler *pDVar2;
  Recycler *pRVar3;
  WriteBarrierPtr<void> *ptr;
  size_t count;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  pRVar3 = scriptContext->recycler;
  pDVar2 = GetTypeHandler(this);
  iVar1 = pDVar2->slotCapacity;
  pDVar2 = GetTypeHandler(this);
  if ((int)(uint)pDVar2->inlineSlotCapacity < iVar1) {
    count = (long)iVar1 - (ulong)pDVar2->inlineSlotCapacity;
    local_50 = (undefined1  [8])&Memory::WriteBarrierPtr<void>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_98f4aea;
    data.filename._0_4_ = 0xd4;
    data.plusSize = count;
    pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,(TrackAllocData *)local_50);
    ptr = Memory::AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<void>,false>
                    ((Memory *)pRVar3,(Recycler *)Memory::Recycler::AllocZero,0,count);
    Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::WriteBarrierSet
              (&instance->auxSlots,ptr);
  }
  return;
}

Assistant:

void DynamicObject::InitSlots(DynamicObject * instance, ScriptContext * scriptContext)
    {
        Recycler * recycler = scriptContext->GetRecycler();
        int slotCapacity = GetTypeHandler()->GetSlotCapacity();
        int inlineSlotCapacity = GetTypeHandler()->GetInlineSlotCapacity();
        if (slotCapacity > inlineSlotCapacity)
        {
            instance->auxSlots = RecyclerNewArrayZ(recycler, Field(Var), slotCapacity - inlineSlotCapacity);
        }
    }